

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O1

int * Gia_SortFloats(float *pArray,int *pPerm,int nSize)

{
  ulong uVar1;
  
  if (pPerm == (int *)0x0) {
    pPerm = (int *)malloc((long)nSize * 4);
    if (0 < nSize) {
      uVar1 = 0;
      do {
        pPerm[uVar1] = (int)uVar1;
        uVar1 = uVar1 + 1;
      } while ((uint)nSize != uVar1);
    }
  }
  sort_rec3(pArray,pPerm,nSize);
  return pPerm;
}

Assistant:

int * Gia_SortFloats( float * pArray, int * pPerm, int nSize )
{
    int i;
    if ( pPerm == NULL )
    {
        pPerm = ABC_ALLOC( int, nSize );
        for ( i = 0; i < nSize; i++ )
            pPerm[i] = i;
    }
    minisat_sort3( pArray, pPerm, nSize );
//    for ( i = 1; i < nSize; i++ )
//        assert( pArray[i-1] <= pArray[i] );
    return pPerm;
}